

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra_shortest_paths.hpp
# Opt level: O2

void boost::detail::
     dijkstra_dispatch2<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::iterator_property_map<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,double,double&>,boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,boost::bgl_named_params<boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>>
               (undefined8 g,undefined8 s,undefined8 param_3,undefined4 param_4,long param_5)

{
  dijkstra_shortest_paths<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::dijkstra_visitor<boost::null_visitor>,unsigned_long*,boost::iterator_property_map<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,double,double&>,boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,std::less<double>,boost::detail::_project2nd<double,double>,double,double,boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>
            (0x7fefffffffffffff,0,g,s,*(undefined8 *)(param_5 + 0x18),param_3,param_4);
  return;
}

Assistant:

inline void
    dijkstra_dispatch2
      (const VertexListGraph& g,
       typename graph_traits<VertexListGraph>::vertex_descriptor s,
       DistanceMap distance, WeightMap weight, IndexMap index_map,
       const Params& params)
    {
      // Default for predecessor map
      dummy_property_map p_map;

      typedef typename property_traits<DistanceMap>::value_type D;
      D inf = choose_param(get_param(params, distance_inf_t()),
                           (std::numeric_limits<D>::max)());

      dijkstra_shortest_paths
        (g, s,
         choose_param(get_param(params, vertex_predecessor), p_map),
         distance, weight, index_map,
         choose_param(get_param(params, distance_compare_t()),
                      std::less<D>()),
         choose_param(get_param(params, distance_combine_t()),
                      closed_plus<D>(inf)),
         inf,
         choose_param(get_param(params, distance_zero_t()),
                      D()),
         choose_param(get_param(params, graph_visitor),
                      make_dijkstra_visitor(null_visitor())),
         params);
    }